

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O2

void __thiscall
FMapInfoParser::ParseIntermissionAction(FMapInfoParser *this,FIntermissionDescriptor *desc)

{
  bool bVar1;
  int iVar2;
  FIntermissionActionTextscreen *this_00;
  FIntermissionAction *ac;
  
  ac = (FIntermissionAction *)0x0;
  FScanner::MustGetToken(&this->sc,0x101);
  bVar1 = FScanner::Compare(&this->sc,"image");
  if (bVar1) {
    this_00 = (FIntermissionActionTextscreen *)operator_new(0x60);
    FIntermissionAction::FIntermissionAction((FIntermissionAction *)this_00);
    ac = (FIntermissionAction *)this_00;
  }
  else {
    bVar1 = FScanner::Compare(&this->sc,"scroller");
    if (bVar1) {
      this_00 = (FIntermissionActionTextscreen *)operator_new(0x78);
      FIntermissionActionScroller::FIntermissionActionScroller
                ((FIntermissionActionScroller *)this_00);
      ac = (FIntermissionAction *)this_00;
    }
    else {
      bVar1 = FScanner::Compare(&this->sc,"cast");
      if (bVar1) {
        this_00 = (FIntermissionActionTextscreen *)operator_new(0x80);
        FIntermissionActionCast::FIntermissionActionCast((FIntermissionActionCast *)this_00);
        ac = (FIntermissionAction *)this_00;
      }
      else {
        bVar1 = FScanner::Compare(&this->sc,"Fader");
        if (bVar1) {
          this_00 = (FIntermissionActionTextscreen *)operator_new(0x68);
          FIntermissionActionFader::FIntermissionActionFader((FIntermissionActionFader *)this_00);
          ac = (FIntermissionAction *)this_00;
        }
        else {
          bVar1 = FScanner::Compare(&this->sc,"Wiper");
          if (bVar1) {
            this_00 = (FIntermissionActionTextscreen *)operator_new(0x68);
            FIntermissionActionWiper::FIntermissionActionWiper((FIntermissionActionWiper *)this_00);
            ac = (FIntermissionAction *)this_00;
          }
          else {
            bVar1 = FScanner::Compare(&this->sc,"TextScreen");
            if (bVar1) {
              this_00 = (FIntermissionActionTextscreen *)operator_new(0x80);
              FIntermissionActionTextscreen::FIntermissionActionTextscreen(this_00);
              ac = (FIntermissionAction *)this_00;
            }
            else {
              bVar1 = FScanner::Compare(&this->sc,"GotoTitle");
              if (bVar1) {
                this_00 = (FIntermissionActionTextscreen *)operator_new(0x60);
                FIntermissionAction::FIntermissionAction((FIntermissionAction *)this_00);
                (this_00->super_FIntermissionAction).mClass = (PClass *)0xfffffffffffffffe;
                ac = (FIntermissionAction *)this_00;
              }
              else {
                bVar1 = FScanner::Compare(&this->sc,"Link");
                if (bVar1) {
                  FScanner::MustGetToken(&this->sc,0x3d);
                  FScanner::MustGetToken(&this->sc,0x101);
                  FName::operator=(&desc->mLink,(this->sc).String);
                  return;
                }
                this_00 = (FIntermissionActionTextscreen *)0x0;
                FScanner::ScriptMessage
                          (&this->sc,"Unknown intermission type \'%s\'",(this->sc).String);
              }
            }
          }
        }
      }
    }
  }
  FScanner::MustGetToken(&this->sc,0x7b);
LAB_00328d4e:
  bVar1 = FScanner::CheckToken(&this->sc,0x7d);
  if (bVar1) {
    if (this_00 != (FIntermissionActionTextscreen *)0x0) {
      TArray<FIntermissionAction_*,_FIntermissionAction_*>::Push
                (&(desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>,&ac);
    }
    return;
  }
  bVar1 = FScanner::CheckToken(&this->sc,0x14a);
  if (!bVar1) {
    FScanner::MustGetToken(&this->sc,0x101);
  }
  if (this_00 != (FIntermissionActionTextscreen *)0x0) goto code_r0x00328d7f;
  goto LAB_00328d9f;
code_r0x00328d7f:
  iVar2 = (*(this_00->super_FIntermissionAction)._vptr_FIntermissionAction[2])(this_00,this);
  if ((char)iVar2 == '\0') {
    FScanner::ScriptMessage(&this->sc,"Unknown key name \'%s\'\n",(this->sc).String);
LAB_00328d9f:
    SkipToNext(this);
  }
  goto LAB_00328d4e;
}

Assistant:

void FMapInfoParser::ParseIntermissionAction(FIntermissionDescriptor *desc)
{
	FIntermissionAction *ac = NULL;

	sc.MustGetToken(TK_Identifier);
	if (sc.Compare("image"))
	{
		ac = new FIntermissionAction;
	}
	else if (sc.Compare("scroller"))
	{
		ac = new FIntermissionActionScroller;
	}
	else if (sc.Compare("cast"))
	{
		ac = new FIntermissionActionCast;
	}
	else if (sc.Compare("Fader"))
	{
		ac = new FIntermissionActionFader;
	}
	else if (sc.Compare("Wiper"))
	{
		ac = new FIntermissionActionWiper;
	}
	else if (sc.Compare("TextScreen"))
	{
		ac = new FIntermissionActionTextscreen;
	}
	else if (sc.Compare("GotoTitle"))
	{
		ac = new FIntermissionAction;
		ac->mClass = TITLE_ID;
	}
	else if (sc.Compare("Link"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_Identifier);
		desc->mLink = sc.String;
		return;
	}
	else
	{
		sc.ScriptMessage("Unknown intermission type '%s'", sc.String);
	}

	sc.MustGetToken('{');
	while (!sc.CheckToken('}'))
	{
		bool success = false;
		if (!sc.CheckToken(TK_Sound))
		{
			sc.MustGetToken(TK_Identifier);
		}
		if (ac != NULL)
		{
			success = ac->ParseKey(sc);
			if (!success)
			{
				sc.ScriptMessage("Unknown key name '%s'\n", sc.String);
			}
		}
		if (!success) SkipToNext();
	}
	if (ac != NULL) desc->mActions.Push(ac);
}